

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O3

bool __thiscall BamTools::BamAlignment::GetTagType(BamAlignment *this,string *tag,char *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  size_type sVar3;
  bool bVar4;
  byte bVar5;
  char *pTagData;
  uint numBytesParsed;
  uint tagDataLength;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  pointer local_48;
  uint local_40;
  uint local_3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (((this->SupportData).HasCoreOnly == false) &&
     (sVar3 = (this->TagData)._M_string_length, sVar3 != 0)) {
    local_48 = (this->TagData)._M_dataplus._M_p;
    local_3c = (uint)sVar3;
    local_40 = 0;
    bVar4 = FindTag(this,tag,&local_48,&local_3c,&local_40);
    if (bVar4) {
      cVar2 = local_48[-1];
      *type = cVar2;
      bVar5 = cVar2 + 0xbf;
      if ((bVar5 < 0x33) && ((0x4012402040187U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) {
        return true;
      }
      paVar1 = &local_68.field_2;
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"invalid tag type: ","");
      std::operator+(&local_38,&local_68,*type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"BamAlignment::GetTagType","");
      SetErrorString(this,&local_68,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
    }
  }
  return false;
}

Assistant:

bool BamAlignment::GetTagType(const std::string& tag, char& type) const
{

    // skip if alignment is core-only
    if (SupportData.HasCoreOnly) {
        // TODO: set error string?
        return false;
    }

    // skip if no tags present
    if (TagData.empty()) {
        // TODO: set error string?
        return false;
    }

    // localize the tag data
    char* pTagData = (char*)TagData.data();
    const unsigned int tagDataLength = TagData.size();
    unsigned int numBytesParsed = 0;

    // if tag not found, return failure
    if (!FindTag(tag, pTagData, tagDataLength, numBytesParsed)) {
        // TODO: set error string?
        return false;
    }

    // otherwise, retrieve & validate tag type code
    type = *(pTagData - 1);
    switch (type) {
        case (Constants::BAM_TAG_TYPE_ASCII):
        case (Constants::BAM_TAG_TYPE_INT8):
        case (Constants::BAM_TAG_TYPE_UINT8):
        case (Constants::BAM_TAG_TYPE_INT16):
        case (Constants::BAM_TAG_TYPE_UINT16):
        case (Constants::BAM_TAG_TYPE_INT32):
        case (Constants::BAM_TAG_TYPE_UINT32):
        case (Constants::BAM_TAG_TYPE_FLOAT):
        case (Constants::BAM_TAG_TYPE_STRING):
        case (Constants::BAM_TAG_TYPE_HEX):
        case (Constants::BAM_TAG_TYPE_ARRAY):
            return true;

        // unknown tag type
        default:
            const std::string message = std::string("invalid tag type: ") + type;
            SetErrorString("BamAlignment::GetTagType", message);
            return false;
    }
}